

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem.cpp
# Opt level: O3

void __thiscall
Problem::Problem(Problem *this,node *bidsArray,int numBids,int numCompanies,int numRegions)

{
  vector<node,std::allocator<node>> *pvVar1;
  vector<node,_std::allocator<node>_> *pvVar2;
  iterator iVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong *puVar6;
  int *piVar7;
  pointer *ppnVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  node emptyNode;
  vector<int,_std::allocator<int>_> local_9cc8;
  vector<int,_std::allocator<int>_> local_9ca8;
  node local_9c88;
  
  local_9ca8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_9ca8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_9ca8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  State::State(&this->state,&local_9ca8,0.0,0);
  if (local_9ca8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_9ca8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_9cc8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_9cc8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_9cc8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  State::State(&this->initialState,&local_9cc8,0.0,0);
  if (local_9cc8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_9cc8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  uVar12 = (ulong)numCompanies;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar12;
  uVar5 = SUB168(auVar4 * ZEXT816(0x18),0);
  uVar9 = uVar5 + 8;
  if (0xfffffffffffffff7 < uVar5) {
    uVar9 = 0xffffffffffffffff;
  }
  if (SUB168(auVar4 * ZEXT816(0x18),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  (this->validStateStore).c.super__Vector_base<State,_std::allocator<State>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->validStateStore).c.super__Vector_base<State,_std::allocator<State>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->validStateStore).c.super__Vector_base<State,_std::allocator<State>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar6 = (ulong *)operator_new__(uVar9);
  *puVar6 = uVar12;
  if (numCompanies != 0) {
    memset((vector<node,_std::allocator<node>_> *)(puVar6 + 1),0,
           ((uVar5 - 0x18) / 0x18) * 0x18 + 0x18);
  }
  this->problemData = (vector<node,_std::allocator<node>_> *)(puVar6 + 1);
  uVar5 = 0xffffffffffffffff;
  if (-1 < numCompanies) {
    uVar5 = uVar12 * 4;
  }
  piVar7 = (int *)operator_new__(uVar5);
  this->maxBids = piVar7;
  this->numCompanies = numCompanies;
  this->numRegions = numRegions;
  this->validStoreSize = 100;
  if (0 < numCompanies) {
    lVar10 = 0;
    iVar11 = 0;
    do {
      local_9c88.price = 0.0;
      local_9c88.norc = 0;
      pvVar2 = this->problemData;
      pvVar1 = (vector<node,std::allocator<node>> *)
               ((long)&(pvVar2->super__Vector_base<node,_std::allocator<node>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar10);
      iVar3._M_current =
           *(node **)((long)&(pvVar2->super__Vector_base<node,_std::allocator<node>_>)._M_impl.
                             super__Vector_impl_data._M_finish + lVar10);
      local_9c88.cid = iVar11;
      if (iVar3._M_current ==
          *(node **)((long)&(pvVar2->super__Vector_base<node,_std::allocator<node>_>)._M_impl.
                            super__Vector_impl_data._M_end_of_storage + lVar10)) {
        std::vector<node,std::allocator<node>>::_M_realloc_insert<node_const&>
                  (pvVar1,iVar3,&local_9c88);
      }
      else {
        memcpy(iVar3._M_current,&local_9c88,0x9c58);
        pvVar1 = pvVar1 + 8;
        *(long *)pvVar1 = *(long *)pvVar1 + 0x9c58;
      }
      iVar11 = iVar11 + 1;
      lVar10 = lVar10 + 0x18;
    } while ((ulong)(uint)numCompanies * 0x18 != lVar10);
  }
  if (0 < numBids) {
    uVar5 = (ulong)(uint)numBids;
    do {
      pvVar1 = (vector<node,std::allocator<node>> *)(this->problemData + bidsArray->cid);
      iVar3._M_current = *(node **)(pvVar1 + 8);
      if (iVar3._M_current == *(node **)(pvVar1 + 0x10)) {
        std::vector<node,std::allocator<node>>::_M_realloc_insert<node_const&>
                  (pvVar1,iVar3,bidsArray);
      }
      else {
        memcpy(iVar3._M_current,bidsArray,0x9c58);
        *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 0x9c58;
      }
      bidsArray = bidsArray + 1;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  if (0 < numCompanies) {
    piVar7 = this->maxBids;
    ppnVar8 = &(this->problemData->super__Vector_base<node,_std::allocator<node>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    uVar5 = 0;
    do {
      piVar7[uVar5] =
           (int)((ulong)((long)*ppnVar8 - (long)((_Vector_impl_data *)(ppnVar8 + -1))->_M_start) >>
                3) * -0x63ad83dd;
      uVar5 = uVar5 + 1;
      ppnVar8 = ppnVar8 + 3;
    } while ((uint)numCompanies != uVar5);
  }
  return;
}

Assistant:

Problem::Problem(struct node bidsArray[], int numBids, int numCompanies, int numRegions) {
    // get problem data and company size from bidsArray

    this->problemData = new vector<struct node>[numCompanies];
    this->maxBids = new int[numCompanies];
    this->numCompanies = numCompanies;
    this->numRegions = numRegions;
    this->validStoreSize = 100;

    //Add no bid node for each company
    for (int i = 0; i < numCompanies; i++) {
        struct node emptyNode;
        emptyNode.cid = i;
        emptyNode.price = 0;
        emptyNode.norc = 0;
        this->problemData[i].push_back(emptyNode);
    }

    //Arrange input data
    for (int i = 0; i < numBids; i++) {
        int cid = bidsArray[i].cid;
        (this->problemData[cid]).push_back(bidsArray[i]);
    }

    //Initialize maxBids array for all companies
    for (int i = 0; i < numCompanies; i++) {
        this->maxBids[i] = (this->problemData[i]).size();
    }
}